

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::interleave<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pRVar5;
  int n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar6;
  Read<int> RVar7;
  Write<int> local_130;
  undefined1 local_120 [8];
  type f;
  value_type array_1;
  LO i;
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  Write<int> out;
  LO out_size;
  Read<int> *array;
  iterator __end0;
  iterator __begin0;
  vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *__range2;
  LO array_size;
  LO narrays;
  vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays_local;
  ulong local_30;
  ulong local_20;
  
  bVar1 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::empty(arrays);
  if (bVar1) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    pvVar6 = extraout_RDX;
  }
  else {
    sVar3 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::size(arrays);
    iVar2 = (int)sVar3;
    pvVar4 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::front(arrays);
    if (((ulong)(pvVar4->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = ((pvVar4->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (ulong)(pvVar4->write_).shared_alloc_.alloc >> 3;
    }
    n = (int)(local_20 >> 2);
    __end0 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::begin(arrays);
    array = (Read<int> *)
            std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::end(arrays);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end0,(__normal_iterator<Omega_h::Read<int>_*,_std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>_>
                                  *)&array);
      if (!bVar1) break;
      pRVar5 = __gnu_cxx::
               __normal_iterator<Omega_h::Read<int>_*,_std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>_>
               ::operator*(&__end0);
      if (((ulong)(pRVar5->write_).shared_alloc_.alloc & 1) == 0) {
        local_30 = ((pRVar5->write_).shared_alloc_.alloc)->size;
      }
      else {
        local_30 = (ulong)(pRVar5->write_).shared_alloc_.alloc >> 3;
      }
      if ((int)(local_30 >> 2) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
      __gnu_cxx::
      __normal_iterator<Omega_h::Read<int>_*,_std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>_>
      ::operator++(&__end0);
    }
    out.shared_alloc_.direct_ptr._4_4_ = iVar2 * n;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    Write<int>::Write((Write<int> *)local_b0,iVar2 * n,(string *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    for (array_1.write_.shared_alloc_.direct_ptr._0_4_ = 0;
        (int)array_1.write_.shared_alloc_.direct_ptr < iVar2;
        array_1.write_.shared_alloc_.direct_ptr._0_4_ =
             (int)array_1.write_.shared_alloc_.direct_ptr + 1) {
      pvVar4 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::operator[]
                         (arrays,(long)(int)array_1.write_.shared_alloc_.direct_ptr);
      Read<int>::Read((Read<int> *)&f.array.write_.shared_alloc_.direct_ptr,pvVar4);
      Write<int>::Write((Write<int> *)local_120,(Write<int> *)local_b0);
      f.out.shared_alloc_.direct_ptr._4_4_ = (int)array_1.write_.shared_alloc_.direct_ptr;
      f.out.shared_alloc_.direct_ptr._0_4_ = iVar2;
      Read<int>::Read((Read<int> *)&f.narrays,(Read<int> *)&f.array.write_.shared_alloc_.direct_ptr)
      ;
      parallel_for<Omega_h::interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                (n,(type *)local_120,"interleave");
      interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)local_120);
      Read<int>::~Read((Read<int> *)&f.array.write_.shared_alloc_.direct_ptr);
    }
    Write<int>::Write(&local_130,(Write<int> *)local_b0);
    Read<int>::Read((Read<int> *)this,&local_130);
    Write<int>::~Write(&local_130);
    Write<int>::~Write((Write<int> *)local_b0);
    pvVar6 = extraout_RDX_00;
  }
  RVar7.write_.shared_alloc_.direct_ptr = pvVar6;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar7.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}